

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O3

void glfwDefaultWindowHints(void)

{
  if (_glfwInitialized != '\0') {
    _glfw.hints.refreshRate = 0;
    _glfw.hints.samples = 0;
    _glfw.hints.sRGB = '\0';
    _glfw.hints._53_3_ = 0;
    _glfw.hints.glMinor = 0;
    _glfw.hints.glForward = '\0';
    _glfw.hints.glDebug = '\0';
    _glfw.hints._74_2_ = 0;
    _glfw.hints.glProfile = 0;
    _glfw.hints.glRobustness = 0;
    _glfw.hints.accumRedBits = 0;
    _glfw.hints.accumGreenBits = 0;
    _glfw.hints.accumBlueBits = 0;
    _glfw.hints.accumAlphaBits = 0;
    _glfw.hints.clientAPI = 0x30001;
    _glfw.hints.glMajor = 1;
    _glfw.hints.auxBuffers = 0;
    _glfw.hints.stereo = '\0';
    _glfw.hints.resizable = '\x01';
    _glfw.hints.visible = '\x01';
    _glfw.hints.decorated = '\x01';
    _glfw.hints.redBits = 8;
    _glfw.hints.greenBits = 8;
    _glfw.hints.blueBits = 8;
    _glfw.hints.alphaBits = 8;
    _glfw.hints.depthBits = 0x18;
    _glfw.hints.stencilBits = 8;
    return;
  }
  _glfwInputError(0x10001,(char *)0x0);
  return;
}

Assistant:

void glfwDefaultWindowHints(void)
{
    _GLFW_REQUIRE_INIT();

    memset(&_glfw.hints, 0, sizeof(_glfw.hints));

    // The default is OpenGL with minimum version 1.0
    _glfw.hints.clientAPI = GLFW_OPENGL_API;
    _glfw.hints.glMajor = 1;
    _glfw.hints.glMinor = 0;

    // The default is a visible, resizable window with decorations
    _glfw.hints.resizable = GL_TRUE;
    _glfw.hints.visible   = GL_TRUE;
    _glfw.hints.decorated = GL_TRUE;

    // The default is 24 bits of color, 24 bits of depth and 8 bits of stencil
    _glfw.hints.redBits     = 8;
    _glfw.hints.greenBits   = 8;
    _glfw.hints.blueBits    = 8;
    _glfw.hints.alphaBits   = 8;
    _glfw.hints.depthBits   = 24;
    _glfw.hints.stencilBits = 8;
}